

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O2

void symbol_error(lgx_ast_t *ast,lgx_ast_node_t *node,char *fmt,...)

{
  int *piVar1;
  uint uVar2;
  char *pcVar3;
  lgx_list_s *plVar4;
  char in_AL;
  int iVar5;
  lgx_list_s *__ptr;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  va_list args;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  __ptr = (lgx_list_s *)calloc(1,0x28);
  if (__ptr != (lgx_list_s *)0x0) {
    __ptr->next = __ptr;
    __ptr->prev = __ptr;
    *(undefined4 *)&__ptr[1].next = 1;
    iVar5 = lgx_str_init((lgx_str_t *)&__ptr[1].prev,0x100);
    if (iVar5 != 0) {
      free(__ptr);
      return;
    }
    pcVar3 = (ast->lex).source.path;
    if (pcVar3 == (char *)0x0) {
      iVar5 = snprintf((char *)__ptr[2].next,(ulong)*(uint *)&__ptr[1].prev,"[SYMBOL ERROR] ");
    }
    else {
      iVar5 = snprintf((char *)__ptr[2].next,(ulong)*(uint *)&__ptr[1].prev,
                       "[SYMBOL ERROR] [%s:%d:%d] ",pcVar3,(ulong)(node->line + 1),(ulong)node->row)
      ;
    }
    *(int *)((long)&__ptr[1].prev + 4) = iVar5;
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    local_48 = 0x3000000018;
    uVar2 = *(uint *)((long)&__ptr[1].prev + 4);
    iVar5 = vsnprintf((char *)((long)&(__ptr[2].next)->next + (ulong)uVar2),(ulong)(0x100 - uVar2),
                      fmt,&local_48);
    piVar1 = (int *)((long)&__ptr[1].prev + 4);
    *piVar1 = *piVar1 + iVar5;
    plVar4 = (ast->errors).prev;
    (ast->errors).prev = __ptr;
    __ptr->next = &ast->errors;
    __ptr->prev = plVar4;
    plVar4->next = __ptr;
  }
  return;
}

Assistant:

static void symbol_error(lgx_ast_t* ast, lgx_ast_node_t* node, const char *fmt, ...) {
    va_list   args;

    lgx_ast_error_list_t* err = xcalloc(1, sizeof(lgx_ast_error_list_t));
    if (!err) {
        return;
    }

    lgx_list_init(&err->head);
    err->err_no = 1;

    if (lgx_str_init(&err->err_msg, 256)) {
        xfree(err);
        return;
    }

    if (ast->lex.source.path) {
        err->err_msg.length = snprintf(err->err_msg.buffer, err->err_msg.size,
            "[SYMBOL ERROR] [%s:%d:%d] ", ast->lex.source.path, node->line + 1, node->row);
    } else {
        err->err_msg.length = snprintf(err->err_msg.buffer, err->err_msg.size,
            "[SYMBOL ERROR] ");
    }

    va_start(args, fmt);
    err->err_msg.length += vsnprintf(err->err_msg.buffer + err->err_msg.length,
        256 - err->err_msg.length, fmt, args);
    va_end(args);
    
    lgx_list_add_tail(&err->head, &ast->errors);
}